

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationInternallySynchronizedObjectsTests.cpp
# Opt level: O2

bool __thiscall
vkt::synchronization::anon_unknown_0::MultiQueues::getFreeQueue
          (MultiQueues *this,deUint32 *returnQueueFamilyIndex,VkQueue *returnQueues,
          int *returnQueueIndex)

{
  Mutex *this_00;
  int iVar1;
  deUint32 *pdVar2;
  mapped_type *pmVar3;
  size_type __n;
  int index;
  reference rVar4;
  
  this_00 = &this->m_mutex;
  index = 0;
  do {
    iVar1 = (int)(this->m_queues)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (iVar1 <= index) {
LAB_00764b0b:
      return index < iVar1;
    }
    pdVar2 = getQueueFamilyIndex(this,index);
    pmVar3 = std::
             map<unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::synchronization::(anonymous_namespace)::MultiQueues::QueueType>_>_>
             ::operator[](&this->m_queues,pdVar2);
    for (__n = 0; (long)__n <
                  (long)(int)((ulong)((long)(pmVar3->queues).
                                            super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pmVar3->queues).
                                           super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
        __n = __n + 1) {
      de::Mutex::lock(this_00);
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&pmVar3->available,__n);
      if ((*rVar4._M_p & rVar4._M_mask) != 0) {
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&pmVar3->available,__n);
        *rVar4._M_p = *rVar4._M_p & ~rVar4._M_mask;
        pdVar2 = getQueueFamilyIndex(this,index);
        *returnQueueFamilyIndex = *pdVar2;
        *returnQueues =
             (pmVar3->queues).super__Vector_base<vk::VkQueue_s_*,_std::allocator<vk::VkQueue_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start[__n];
        *returnQueueIndex = (int)__n;
        de::Mutex::unlock(this_00);
        goto LAB_00764b0b;
      }
      de::Mutex::unlock(this_00);
    }
    index = index + 1;
  } while( true );
}

Assistant:

bool			getFreeQueue			(deUint32& returnQueueFamilyIndex, VkQueue& returnQueues, int& returnQueueIndex)
	{
		for (int queueFamilyIndexNdx = 0 ; queueFamilyIndexNdx < static_cast<int>(m_queues.size()); ++queueFamilyIndexNdx)
		{
			Queues& queue = m_queues[getQueueFamilyIndex(queueFamilyIndexNdx)];
			for (int queueNdx = 0; queueNdx < static_cast<int>(queue.queues.size()); ++queueNdx)
			{
				m_mutex.lock();
				if (queue.available[queueNdx])
				{
					queue.available[queueNdx]	= false;
					returnQueueFamilyIndex		= getQueueFamilyIndex(queueFamilyIndexNdx);
					returnQueues				= queue.queues[queueNdx];
					returnQueueIndex			= queueNdx;
					m_mutex.unlock();
					return true;
				}
				m_mutex.unlock();
			}
		}
		return false;
	}